

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O3

optional<int> __thiscall
slang::ast::ASTContext::evalInteger
          (ASTContext *this,Expression *expr,bitmask<slang::ast::EvalFlags> extraFlags)

{
  bool bVar1;
  SVIntStorage *other;
  _Optional_payload_base<int> _Var2;
  Diagnostic *this_00;
  _Optional_payload_base<int> _Var3;
  _Optional_payload_base<int> _Var4;
  ConstantValue cv;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  undefined1 local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  bVar1 = requireIntegral(this,expr);
  if (!bVar1) {
    return (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  }
  eval((ConstantValue *)&local_58,this,expr,extraFlags);
  _Var2._1_7_ = 0;
  _Var2._M_payload._M_value._0_1_ = local_58._M_index;
  _Var3 = _Var2;
  _Var4 = _Var2;
  if (local_58._M_index != 0) {
    if (local_58._M_index == 1) {
      other = &std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_58)->super_SVIntStorage;
      if (other->unknownFlag != true) {
        _Var2 = (_Optional_payload_base<int>)SVInt::as<int>((SVInt *)other);
        _Var3 = (_Optional_payload_base<int>)((ulong)_Var2 >> 0x20);
        _Var4 = (_Optional_payload_base<int>)((ulong)_Var2 >> 0x28);
        if (((ulong)_Var2 >> 0x20 & 1) == 0) {
          this_00 = addDiag(this,(DiagCode)0xa0003,expr->sourceRange);
          SVInt::SVInt((SVInt *)&local_80,other);
          local_60 = 1;
          Diagnostic::operator<<(this_00,(ConstantValue *)&local_80);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_80);
          local_80._0_8_ = 0xffffffff80000000;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<long>(&this_00->args,(long *)&local_80);
          local_80._0_8_ = 0x7fffffff;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<long>(&this_00->args,(long *)&local_80);
        }
        goto LAB_007d64e7;
      }
      addDiag(this,(DiagCode)0x90003,expr->sourceRange);
    }
    else {
      addDiag(this,(DiagCode)0x70003,expr->sourceRange);
    }
    _Var4._M_payload = (_Storage<int,_true>)0x0;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
    _Var3._M_payload = (_Storage<int,_true>)0x0;
    _Var3._M_engaged = false;
    _Var3._5_3_ = 0;
    _Var2._M_payload = (_Storage<int,_true>)0x0;
    _Var2._M_engaged = false;
    _Var2._5_3_ = 0;
  }
LAB_007d64e7:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)
         ((ulong)_Var2 & 0xffffffff | ((ulong)_Var3 & 0xff) << 0x20 | (long)_Var4 << 0x28);
}

Assistant:

std::optional<int32_t> ASTContext::evalInteger(const Expression& expr,
                                               bitmask<EvalFlags> extraFlags) const {
    if (!requireIntegral(expr))
        return std::nullopt;

    ConstantValue cv = eval(expr, extraFlags);
    if (!requireIntegral(cv, expr.sourceRange))
        return std::nullopt;

    const SVInt& value = cv.integer();
    if (!requireNoUnknowns(value, expr.sourceRange))
        return std::nullopt;

    auto coerced = value.as<int32_t>();
    if (!coerced) {
        auto& diag = addDiag(diag::ValueOutOfRange, expr.sourceRange);
        diag << value;
        diag << INT32_MIN;
        diag << INT32_MAX;
    }
    return coerced;
}